

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O3

void __thiscall
btHashMap<btHashKey<btTriIndex>,_btTriIndex>::clear
          (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this)

{
  int *piVar1;
  btTriIndex *ptr;
  btHashKey<btTriIndex> *ptr_00;
  
  piVar1 = (this->m_hashTable).m_data;
  if ((piVar1 != (int *)0x0) && ((this->m_hashTable).m_ownsMemory == true)) {
    btAlignedFreeInternal(piVar1);
  }
  (this->m_hashTable).m_ownsMemory = true;
  (this->m_hashTable).m_data = (int *)0x0;
  (this->m_hashTable).m_size = 0;
  (this->m_hashTable).m_capacity = 0;
  piVar1 = (this->m_next).m_data;
  if ((piVar1 != (int *)0x0) && ((this->m_next).m_ownsMemory == true)) {
    btAlignedFreeInternal(piVar1);
  }
  (this->m_next).m_ownsMemory = true;
  (this->m_next).m_data = (int *)0x0;
  (this->m_next).m_size = 0;
  (this->m_next).m_capacity = 0;
  ptr = (this->m_valueArray).m_data;
  if ((ptr != (btTriIndex *)0x0) && ((this->m_valueArray).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr);
  }
  (this->m_valueArray).m_ownsMemory = true;
  (this->m_valueArray).m_data = (btTriIndex *)0x0;
  (this->m_valueArray).m_size = 0;
  (this->m_valueArray).m_capacity = 0;
  ptr_00 = (this->m_keyArray).m_data;
  if ((ptr_00 != (btHashKey<btTriIndex> *)0x0) && ((this->m_keyArray).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_00);
  }
  (this->m_keyArray).m_ownsMemory = true;
  (this->m_keyArray).m_data = (btHashKey<btTriIndex> *)0x0;
  (this->m_keyArray).m_size = 0;
  (this->m_keyArray).m_capacity = 0;
  return;
}

Assistant:

void	clear()
	{
		m_hashTable.clear();
		m_next.clear();
		m_valueArray.clear();
		m_keyArray.clear();
	}